

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleCheck(Fxu_HeapDouble *p)

{
  int iVar1;
  Fxu_Double *pDiv;
  int iVar2;
  
  p->i = 1;
  if (0 < p->nItems) {
    iVar2 = 1;
    do {
      pDiv = p->pTree[iVar2];
      if (pDiv == (Fxu_Double *)0x0) {
        return;
      }
      if (pDiv->HNum != iVar2) {
        __assert_fail("pDiv->HNum == p->i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapD.c"
                      ,0x9d,"void Fxu_HeapDoubleCheck(Fxu_HeapDouble *)");
      }
      Fxu_HeapDoubleCheckOne(p,pDiv);
      iVar1 = p->i;
      iVar2 = iVar1 + 1;
      p->i = iVar2;
    } while (iVar1 < p->nItems);
  }
  return;
}

Assistant:

void Fxu_HeapDoubleCheck( Fxu_HeapDouble * p )
{
	Fxu_Double * pDiv;
	Fxu_HeapDoubleForEachItem( p, pDiv )
	{
		assert( pDiv->HNum == p->i );
        Fxu_HeapDoubleCheckOne( p, pDiv );
	}
}